

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long in_RSI;
  int in_EDI;
  string *in_stack_00000980;
  size_t *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  char *pcVar1;
  string local_88 [32];
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 3) {
    std::operator<<((ostream *)&std::cout,"Please Input the dataset path:");
    std::operator>>((istream *)&std::cin,(string *)FILE_NAME_abi_cxx11_);
    std::operator<<((ostream *)&std::cout,"Please Input the length of record in dtaset:");
    std::istream::operator>>((istream *)&std::cin,&record_length);
  }
  else {
    local_10 = in_RSI;
    std::__cxx11::string::operator=((string *)FILE_NAME_abi_cxx11_,*(char **)(in_RSI + 8));
    pcVar1 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar1,&local_31);
    record_length = std::__cxx11::stoi(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m|         Application: Find Super Spreader         |\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m|                     F1 SCORE                     |\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  std::__cxx11::string::string(local_68,(string *)FILE_NAME_abi_cxx11_);
  SuperSpread_Test_Hitter<4u>((string *)local_68);
  std::__cxx11::string::~string(local_68);
  pcVar1 = "\x1b[0m\x1b[1;32m====================================================\n\x1b[0m";
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  printf("\x1b[0m\x1b[1;32m|                    THROUGHPUT                    |\n\x1b[0m");
  printf(pcVar1);
  std::__cxx11::string::string(local_88,(string *)FILE_NAME_abi_cxx11_);
  SuperSpread_Test_Speed<4u>(in_stack_00000980);
  std::__cxx11::string::~string(local_88);
  printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  // ===================== Determine the threshold==================
  // cout << FILE_NAME << endl;

  // HashMap mp;
  // StreamMap sp;

  // FILE* file = fopen((FILE_NAME).c_str(),"rb");
  // Data from;
  // Data to;
  // uint num = 0;
  // while(num<interval)
  // {
  //     fread(from.str, DATA_LEN, 1, file);
  //     fread(&to.str, DATA_LEN, 1, file);

  //     Stream stream(from, to);
  //     if(sp.find(stream) == sp.end()){
  //         sp[stream] = 1;
  //         if(mp.find(from) == mp.end())
  //             mp[from] = 1;
  //         else
  //             mp[from] += 1;
  //     }
  //     num++;
  // }
  // printf("HIT=%d\n", Get_TopK(mp, 250));
  // ===============================================================
    if (argc > 2)
    {
        FILE_NAME = argv[1];
        record_length = std::stoi(argv[2]);
    }
    else
    {
        std::cout << "Please Input the dataset path:";
        std::cin >> FILE_NAME;
        std::cout << "Please Input the length of record in dtaset:";
        std::cin >> record_length;
    }
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|         Application: Find Super Spreader         "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|                     F1 SCORE                     "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  SuperSpread_Test_Hitter<4>(FILE_NAME);
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|                    THROUGHPUT                    "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  SuperSpread_Test_Speed<4>(FILE_NAME);
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
}